

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitstream.h
# Opt level: O1

void w128_to_bitstream(bitstream_t *bs,word128 *v,size_t width,size_t size)

{
  ulong uVar1;
  sbyte sVar2;
  ulong *puVar3;
  byte bVar4;
  uint uVar5;
  byte *pbVar6;
  uint uVar7;
  uint uVar8;
  uint uVar9;
  ulong uVar10;
  uint64_t buf [4];
  
  buf[0] = (*v)[0];
  buf[1] = (*v)[1];
  buf[2] = v[1][0];
  buf[3] = v[1][1];
  puVar3 = buf + (width - 1);
  if (0x3f < size) {
    do {
      uVar1 = *puVar3;
      uVar10 = bs->position;
      pbVar6 = (bs->buffer).w + (uVar10 >> 3);
      uVar8 = (uint)uVar10 & 7;
      bs->position = uVar10 + 0x40;
      if ((uVar10 & 7) == 0) {
        uVar10 = 0x40;
      }
      else {
        uVar10 = (ulong)(uVar8 | 0x38);
        *pbVar6 = (byte)(uVar1 >> uVar10) |
                  (byte)(0xff << ((byte)(8 - (char)uVar8) & 0x1f)) & *pbVar6;
        pbVar6 = pbVar6 + 1;
      }
      do {
        uVar10 = uVar10 - 8;
        *pbVar6 = (byte)(uVar1 >> (uVar10 & 0x3f));
        pbVar6 = pbVar6 + 1;
      } while (7 < uVar10);
      if (uVar10 != 0) {
        bVar4 = (byte)uVar10;
        sVar2 = (bVar4 < 0x21) * (' ' - bVar4);
        *pbVar6 = (char)((uint)((int)uVar1 << sVar2) >> sVar2) << ((ulong)(byte)(8 - bVar4) & 0x3f)
                  | (byte)(0xff >> ((uint)uVar10 & 0x1f)) & *pbVar6;
      }
      size = size - 0x40;
      puVar3 = puVar3 + -1;
    } while (0x3f < size);
  }
  if (size != 0) {
    uVar8 = (uint)size;
    uVar10 = *puVar3 >> ((ulong)(byte)-(char)size & 0x3f);
    uVar1 = bs->position;
    pbVar6 = (bs->buffer).w + (uVar1 >> 3);
    uVar5 = (uint)uVar1 & 7;
    bs->position = uVar1 + size;
    if ((uVar1 & 7) != 0) {
      uVar7 = 8 - uVar5;
      uVar9 = uVar8;
      if (uVar7 < uVar8) {
        uVar9 = uVar7;
      }
      size = (size_t)(uVar8 - uVar9);
      *pbVar6 = (byte)((uVar10 >> (size & 0x3f)) << ((ulong)(uVar7 - uVar9) & 0x3f)) |
                ((byte)(0xff >> (uVar5 + uVar9 & 0x1f)) | (byte)(0xff << (uVar7 & 0x1f))) & *pbVar6;
      pbVar6 = pbVar6 + 1;
    }
    if (7 < (uint)size) {
      size = size & 0xffffffff;
      do {
        size = size - 8;
        *pbVar6 = (byte)(uVar10 >> (size & 0x3f));
        pbVar6 = pbVar6 + 1;
      } while (7 < size);
    }
    if ((uint)size != 0) {
      bVar4 = (byte)size;
      sVar2 = (bVar4 < 0x21) * (' ' - bVar4);
      *pbVar6 = (char)((uint)((int)uVar10 << sVar2) >> sVar2) << ((ulong)(byte)(8 - bVar4) & 0x3f) |
                (byte)(0xff >> ((uint)size & 0x1f)) & *pbVar6;
    }
  }
  return;
}

Assistant:

ATTR_TARGET_S128
static inline void w128_to_bitstream(bitstream_t* bs, const word128 v[2], const size_t width,
                                     const size_t size) {
  ATTR_ALIGNED(16) uint64_t buf[4];
  mm128_store(&buf[0], v[0]);
  mm128_store(&buf[2], v[1]);

  const uint64_t* d = &buf[width - 1];
  size_t bits       = size;
  for (; bits >= sizeof(uint64_t) * 8; bits -= sizeof(uint64_t) * 8, --d) {
    bitstream_put_bits(bs, *d, sizeof(uint64_t) * 8);
  }
  if (bits) {
    bitstream_put_bits(bs, *d >> (sizeof(uint64_t) * 8 - bits), bits);
  }
}